

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O3

void get_builtin(gen_ctx_t gen_ctx,MIR_insn_code_t code,MIR_item_t_conflict *proto_item,
                MIR_item_t_conflict *func_import_item)

{
  MIR_context_t ctx;
  undefined8 in_RAX;
  MIR_item_t_conflict pMVar1;
  code *addr;
  char *name;
  undefined4 uStack_38;
  MIR_type_t res_type;
  
  ctx = gen_ctx->ctx;
  *proto_item = (MIR_item_t_conflict)0x0;
  *func_import_item = (MIR_item_t_conflict)0x0;
  uStack_38 = (undefined4)in_RAX;
  switch(code) {
  case MIR_UI2F:
    _uStack_38 = CONCAT44(8,uStack_38);
    pMVar1 = _MIR_builtin_proto(ctx,gen_ctx->curr_func_item->module,"mir.ui2f.p",1,&res_type,1,6,"v"
                               );
    *proto_item = pMVar1;
    name = "mir.ui2f";
    addr = mir_ui2f;
    break;
  case MIR_UI2D:
    _uStack_38 = CONCAT44(9,uStack_38);
    pMVar1 = _MIR_builtin_proto(ctx,gen_ctx->curr_func_item->module,"mir.ui2d.p",1,&res_type,1,6,"v"
                               );
    *proto_item = pMVar1;
    name = "mir.ui2d";
    addr = mir_ui2d;
    break;
  case MIR_UI2LD:
    _uStack_38 = CONCAT44(10,uStack_38);
    pMVar1 = _MIR_builtin_proto(ctx,gen_ctx->curr_func_item->module,"mir.ui2ld.p",1,&res_type,1,6,
                                "v");
    *proto_item = pMVar1;
    name = "mir.ui2ld";
    addr = mir_ui2ld;
    break;
  case MIR_F2I:
  case MIR_D2I:
switchD_00169b13_caseD_10:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                  ,0x249,"void get_builtin(gen_ctx_t, MIR_insn_code_t, MIR_item_t *, MIR_item_t *)")
    ;
  case MIR_LD2I:
    _uStack_38 = CONCAT44(6,uStack_38);
    pMVar1 = _MIR_builtin_proto(ctx,gen_ctx->curr_func_item->module,"mir.ld2i.p",1,&res_type,1,10,
                                "v");
    *proto_item = pMVar1;
    name = "mir.ld2i";
    addr = mir_ld2i;
    break;
  default:
    if (code == MIR_VA_ARG) {
      _uStack_38 = CONCAT44(6,uStack_38);
      pMVar1 = _MIR_builtin_proto(ctx,gen_ctx->curr_func_item->module,"mir.va_arg.p",1,&res_type,2,6
                                  ,"va",6,"type",_uStack_38);
      *proto_item = pMVar1;
      addr = va_arg_builtin;
      name = "mir.va_arg";
    }
    else {
      if (code != MIR_VA_BLOCK_ARG) goto switchD_00169b13_caseD_10;
      _uStack_38 = in_RAX;
      pMVar1 = _MIR_builtin_proto(ctx,gen_ctx->curr_func_item->module,"mir.va_block_arg.p",0,
                                  (MIR_type_t *)0x0,4,6,"res",6,"va",6,"size",6,"ncase");
      *proto_item = pMVar1;
      addr = va_block_arg_builtin;
      name = "mir.va_block_arg";
    }
  }
  pMVar1 = _MIR_builtin_func(ctx,gen_ctx->curr_func_item->module,name,addr);
  *func_import_item = pMVar1;
  return;
}

Assistant:

static void get_builtin (gen_ctx_t gen_ctx, MIR_insn_code_t code, MIR_item_t *proto_item,
                         MIR_item_t *func_import_item) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_type_t res_type;

  *func_import_item = *proto_item = NULL; /* to remove uninitialized warning */
  switch (code) {
  case MIR_UI2F:
    res_type = MIR_T_F;
    *proto_item
      = _MIR_builtin_proto (ctx, curr_func_item->module, UI2F_P, 1, &res_type, 1, MIR_T_I64, "v");
    *func_import_item = _MIR_builtin_func (ctx, curr_func_item->module, UI2F, mir_ui2f);
    break;
  case MIR_UI2D:
    res_type = MIR_T_D;
    *proto_item
      = _MIR_builtin_proto (ctx, curr_func_item->module, UI2D_P, 1, &res_type, 1, MIR_T_I64, "v");
    *func_import_item = _MIR_builtin_func (ctx, curr_func_item->module, UI2D, mir_ui2d);
    break;
  case MIR_UI2LD:
    res_type = MIR_T_LD;
    *proto_item
      = _MIR_builtin_proto (ctx, curr_func_item->module, UI2LD_P, 1, &res_type, 1, MIR_T_I64, "v");
    *func_import_item = _MIR_builtin_func (ctx, curr_func_item->module, UI2LD, mir_ui2ld);
    break;
  case MIR_LD2I:
    res_type = MIR_T_I64;
    *proto_item
      = _MIR_builtin_proto (ctx, curr_func_item->module, LD2I_P, 1, &res_type, 1, MIR_T_LD, "v");
    *func_import_item = _MIR_builtin_func (ctx, curr_func_item->module, LD2I, mir_ld2i);
    break;
  case MIR_VA_ARG:
    res_type = MIR_T_I64;
    *proto_item = _MIR_builtin_proto (ctx, curr_func_item->module, VA_ARG_P, 1, &res_type, 2,
                                      MIR_T_I64, "va", MIR_T_I64, "type");
    *func_import_item = _MIR_builtin_func (ctx, curr_func_item->module, VA_ARG, va_arg_builtin);
    break;
  case MIR_VA_BLOCK_ARG:
    *proto_item
      = _MIR_builtin_proto (ctx, curr_func_item->module, VA_BLOCK_ARG_P, 0, NULL, 4, MIR_T_I64,
                            "res", MIR_T_I64, "va", MIR_T_I64, "size", MIR_T_I64, "ncase");
    *func_import_item
      = _MIR_builtin_func (ctx, curr_func_item->module, VA_BLOCK_ARG, va_block_arg_builtin);
    break;
  default: assert (FALSE);
  }
}